

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_bench.cc
# Opt level: O1

bool track_stat(stat_history_t *stat,uint64_t lat)

{
  iterator __position;
  uint64_t local_10;
  
  if (stat != (stat_history_t *)0x0 && lat != 0xffffffff) {
    __position._M_current =
         (stat->latencies).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (stat->latencies).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_10 = lat;
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&stat->latencies,__position,
                 &local_10);
    }
    else {
      *__position._M_current = lat;
      (stat->latencies).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return stat != (stat_history_t *)0x0 && lat != 0xffffffff;
}

Assistant:

bool track_stat(stat_history_t *stat, uint64_t lat) {

    if (lat == (uint64_t)ERR_NS) {
      return false;
    }

    if (stat) {
        stat->latencies.push_back(lat);
        return true;
    } else {
        return false;
    }
}